

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O2

void __thiscall cppcms::widgets::numeric<double>::load(numeric<double> *this)

{
  context *in_RSI;
  
  load((numeric<double> *)(&this->super_base_html_input + *(long *)(*(long *)this + -0x20)),in_RSI);
  return;
}

Assistant:

virtual void load(http::context &context)
			{
				pre_load(context);

				loaded_string_.clear();

				set(false);
				valid(true);

				http::request::form_type::const_iterator p;
				http::request::form_type const &request=context.request().post_or_get();
				p=request.find(name());
				if(p==request.end()) {
					return;
				}
				else {
					loaded_string_=p->second;
					if(loaded_string_.empty())
						return;

					std::istringstream ss(loaded_string_);
					ss.imbue(context.locale());
					ss>>value_;
					if(ss.fail() || !ss.eof())
						valid(false);
					else
						set(true);
				}
			}